

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

void lj_debug_dumpstack(lua_State *L,SBuf *sb,char *fmt,int depth)

{
  char cVar1;
  uint64_t uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  cTValue *pcVar6;
  size_t sVar7;
  char *pcVar8;
  GCfunc *fn;
  char *pcVar9;
  uint uVar10;
  uint local_70;
  int size;
  lua_State *local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  char *local_50;
  cTValue *local_48;
  cTValue *local_40;
  char *name;
  
  local_5c = depth >> 0x1f | 1;
  uVar10 = 0xffffffff;
  if (depth < -1) {
    uVar10 = depth;
  }
  uVar10 = ~uVar10;
  local_58 = 0xffffffff;
  if (-1 < depth) {
    local_58 = depth;
  }
  iVar5 = 1;
  local_70 = 0;
  local_68 = L;
  local_60 = depth;
  local_50 = fmt;
  for (; uVar10 != local_58; uVar10 = uVar10 + local_5c) {
    pcVar6 = lj_debug_frame(local_68,uVar10,&size);
    if (pcVar6 != (cTValue *)0x0) {
      local_48 = pcVar6 + size;
      if ((long)size == 0) {
        local_48 = (cTValue *)0x0;
      }
      fn = (GCfunc *)(pcVar6[-1].u64 & 0x7fffffffffff);
      pcVar9 = local_50;
      local_54 = uVar10;
      local_40 = pcVar6;
      iVar4 = iVar5;
LAB_0010bf74:
      do {
        while( true ) {
          iVar5 = iVar4;
          cVar1 = *pcVar9;
          pcVar9 = pcVar9 + 1;
          iVar4 = iVar5;
          if (cVar1 != 'F') break;
LAB_0010bfc4:
          pcVar8 = lj_debug_funcname(local_68,local_40,&name);
          if (pcVar8 == (char *)0x0) {
LAB_0010c041:
            if ((fn->c).ffid == '\x01') {
              pcVar8 = sb->w;
              if (*(int *)&sb->e == (int)pcVar8) {
                pcVar8 = lj_buf_more2(sb,1);
              }
              *pcVar8 = '@';
              sb->w = pcVar8 + 1;
              lj_strfmt_putptr(sb,(fn->c).f);
            }
            else if ((fn->c).ffid == '\0') {
              lVar3 = *(long *)((long)fn + 0x20);
              iVar5 = debug_putchunkname(sb,(GCproto *)(lVar3 + -0x68),iVar5);
              if (iVar5 != 0) {
                if (cVar1 == 'l') {
                  iVar5 = debug_frameline(local_68,fn,local_48);
                }
                else {
                  iVar5 = *(int *)(lVar3 + -0x20);
                }
                pcVar8 = sb->w;
                if (*(int *)&sb->e == (int)pcVar8) {
                  pcVar8 = lj_buf_more2(sb,1);
                }
                *pcVar8 = ':';
                sb->w = pcVar8 + 1;
                if (iVar5 < 0) {
                  iVar5 = *(int32_t *)(lVar3 + -0x20);
                }
                lj_strfmt_putint(sb,iVar5);
              }
            }
            else {
              lj_buf_putmem(sb,"[builtin#",9);
              lj_strfmt_putint(sb,(uint)(fn->c).ffid);
              pcVar8 = sb->w;
              if (*(int *)&sb->e == (int)pcVar8) {
                pcVar8 = lj_buf_more2(sb,1);
              }
              *pcVar8 = ']';
LAB_0010c105:
              sb->w = pcVar8 + 1;
              iVar4 = iVar5;
            }
          }
          else {
            if (((cVar1 == 'F') && ((fn->c).ffid == '\0')) &&
               (uVar2 = (fn->c).pc.ptr64, *(int *)(uVar2 - 0x20) != -1)) {
              debug_putchunkname(sb,(GCproto *)(uVar2 - 0x68),iVar5);
              pcVar8 = sb->w;
              if (*(int *)&sb->e == (int)pcVar8) {
                pcVar8 = lj_buf_more2(sb,1);
              }
              *pcVar8 = ':';
              sb->w = pcVar8 + 1;
            }
            pcVar8 = name;
            sVar7 = strlen(name);
            lj_buf_putmem(sb,pcVar8,(MSize)sVar7);
          }
        }
        if (cVar1 != 'Z') {
          if (cVar1 == 'f') goto LAB_0010bfc4;
          if (cVar1 == 'l') goto LAB_0010c041;
          iVar4 = 0;
          if (cVar1 == 'p') goto LAB_0010bf74;
          uVar10 = local_54;
          if (cVar1 != '\0') {
            pcVar8 = sb->w;
            if (*(int *)&sb->e == (int)pcVar8) {
              pcVar8 = lj_buf_more2(sb,1);
            }
            *pcVar8 = cVar1;
            goto LAB_0010c105;
          }
          goto LAB_0010c1a4;
        }
        local_70 = *(int *)&sb->w - *(int *)&sb->b;
      } while( true );
    }
    if (-1 < local_60) break;
    uVar10 = uVar10 - size;
LAB_0010c1a4:
  }
  if (local_70 != 0) {
    sb->w = sb->b + local_70;
  }
  return;
}

Assistant:

void lj_debug_dumpstack(lua_State *L, SBuf *sb, const char *fmt, int depth)
{
  int level = 0, dir = 1, pathstrip = 1;
  MSize lastlen = 0;
  if (depth < 0) { level = ~depth; depth = dir = -1; }  /* Reverse frames. */
  while (level != depth) {  /* Loop through all frame. */
    int size;
    cTValue *frame = lj_debug_frame(L, level, &size);
    if (frame) {
      cTValue *nextframe = size ? frame+size : NULL;
      GCfunc *fn = frame_func(frame);
      const uint8_t *p = (const uint8_t *)fmt;
      int c;
      while ((c = *p++)) {
	switch (c) {
	case 'p':  /* Preserve full path. */
	  pathstrip = 0;
	  break;
	case 'F': case 'f': {  /* Dump function name. */
	  const char *name;
	  const char *what = lj_debug_funcname(L, frame, &name);
	  if (what) {
	    if (c == 'F' && isluafunc(fn)) {  /* Dump module:name for 'F'. */
	      GCproto *pt = funcproto(fn);
	      if (pt->firstline != ~(BCLine)0) {  /* Not a bytecode builtin. */
		debug_putchunkname(sb, pt, pathstrip);
		lj_buf_putb(sb, ':');
	      }
	    }
	    lj_buf_putmem(sb, name, (MSize)strlen(name));
	    break;
	  }  /* else: can't derive a name, dump module:line. */
	  }
	  /* fallthrough */
	case 'l':  /* Dump module:line. */
	  if (isluafunc(fn)) {
	    GCproto *pt = funcproto(fn);
	    if (debug_putchunkname(sb, pt, pathstrip)) {
	      /* Regular Lua function. */
	      BCLine line = c == 'l' ? debug_frameline(L, fn, nextframe) :
				       pt->firstline;
	      lj_buf_putb(sb, ':');
	      lj_strfmt_putint(sb, line >= 0 ? line : pt->firstline);
	    }
	  } else if (isffunc(fn)) {  /* Dump numbered builtins. */
	    lj_buf_putmem(sb, "[builtin#", 9);
	    lj_strfmt_putint(sb, fn->c.ffid);
	    lj_buf_putb(sb, ']');
	  } else {  /* Dump C function address. */
	    lj_buf_putb(sb, '@');
	    lj_strfmt_putptr(sb, fn->c.f);
	  }
	  break;
	case 'Z':  /* Zap trailing separator. */
	  lastlen = sbuflen(sb);
	  break;
	default:
	  lj_buf_putb(sb, c);
	  break;
	}
      }
    } else if (dir == 1) {
      break;
    } else {
      level -= size;  /* Reverse frame order: quickly skip missing level. */
    }
    level += dir;
  }
  if (lastlen)
    sb->w = sb->b + lastlen;  /* Zap trailing separator. */
}